

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O3

void __thiscall re2::Prog::Optimize(Prog *this)

{
  Inst *pIVar1;
  uint uVar2;
  Inst *pIVar3;
  _Head_base<0UL,_int_*,_false> _Var4;
  uint uVar5;
  uint32_t uVar6;
  uint *puVar7;
  uint uVar8;
  uint uVar9;
  Inst *pIVar10;
  long lVar11;
  Deleter DVar12;
  uint uVar13;
  Workq q;
  SparseSetT<void> local_58;
  
  SparseSetT<void>::SparseSetT(&local_58,this->size_);
  local_58.size_ = 0;
  DVar12.len_ = this->start_;
  if ((long)DVar12.len_ != 0) {
    if (((uint *)local_58.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
                 _M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl != (uint *)0x0) &&
       ((uint)DVar12.len_ <
        (uint)local_58.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t
              .super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
              super__Tuple_impl<1UL,_re2::PODArray<int>::Deleter>.
              super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false>._M_head_impl.len_)) {
      local_58.sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
      super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl[DVar12.len_] = 0;
      *local_58.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
       super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
       super__Head_base<0UL,_int_*,_false>._M_head_impl = DVar12.len_;
      uVar5 = 1;
      puVar7 = (uint *)(local_58.dense_.ptr_._M_t.
                        super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                        super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                        super__Head_base<0UL,_int_*,_false>._M_head_impl + 1);
      _Var4._M_head_impl =
           local_58.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
           super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
      local_58.size_ = uVar5;
      do {
        uVar2 = *_Var4._M_head_impl;
        pIVar3 = (this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 _M_t.
                 super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
        uVar8 = pIVar3[(int)uVar2].out_opcode_;
        uVar13 = uVar8;
        do {
          uVar9 = uVar13;
          if (uVar9 < 0x10) {
            uVar6 = uVar8 & 0xf;
            pIVar3[(int)uVar2].out_opcode_ = uVar6;
            goto LAB_001cc3e4;
          }
          DVar12.len_ = uVar9 >> 4;
          uVar13 = pIVar3[(uint)DVar12.len_].out_opcode_;
        } while ((pIVar3[(uint)DVar12.len_].out_opcode_ & 7) == 6);
        uVar6 = uVar8 & 0xf | uVar9 & 0xfffffff0;
        pIVar3[(int)uVar2].out_opcode_ = uVar6;
        if (((uint *)local_58.dense_.ptr_._M_t.
                     super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                     super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                     super__Head_base<0UL,_int_*,_false>._M_head_impl != (uint *)0x0) &&
           ((uint)DVar12.len_ <
            (uint)local_58.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
                  _M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                  super__Tuple_impl<1UL,_re2::PODArray<int>::Deleter>.
                  super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false>._M_head_impl.len_)) {
          if ((uVar5 <= (uint)local_58.sparse_.ptr_._M_t.
                              super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                              super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                              super__Head_base<0UL,_int_*,_false>._M_head_impl[(uint)DVar12.len_])
             || (local_58.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
                 _M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl
                 [local_58.sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>
                  ._M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                  super__Head_base<0UL,_int_*,_false>._M_head_impl[(uint)DVar12.len_]] !=
                 DVar12.len_)) {
            local_58.sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
            super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl[(uint)DVar12.len_] = uVar5;
            *puVar7 = DVar12.len_;
            uVar5 = local_58.size_ + 1;
            uVar6 = pIVar3[(int)uVar2].out_opcode_;
            local_58.size_ = uVar5;
          }
        }
LAB_001cc3e4:
        if ((uVar6 & 7) == 0) {
          DVar12.len_ = pIVar3[(int)uVar2].field_1.out1_;
          uVar5 = local_58.size_;
          if (DVar12.len_ == 0) {
            DVar12.len_ = 0;
          }
          else {
            do {
              uVar8 = pIVar3[DVar12.len_].out_opcode_;
              if ((uVar8 & 7) != 6) {
                pIVar3[(int)uVar2].field_1.out1_ = DVar12.len_;
                if ((((uint *)local_58.dense_.ptr_._M_t.
                              super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                              super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                              super__Head_base<0UL,_int_*,_false>._M_head_impl != (uint *)0x0) &&
                    ((uint)DVar12.len_ <
                     (uint)local_58.dense_.ptr_._M_t.
                           super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                           super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                           super__Tuple_impl<1UL,_re2::PODArray<int>::Deleter>.
                           super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false>._M_head_impl.
                           len_)) &&
                   (((uint)local_58.size_ <=
                     (uint)local_58.sparse_.ptr_._M_t.
                           super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                           super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                           super__Head_base<0UL,_int_*,_false>._M_head_impl[DVar12.len_] ||
                    (local_58.dense_.ptr_._M_t.
                     super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                     super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                     super__Head_base<0UL,_int_*,_false>._M_head_impl
                     [local_58.sparse_.ptr_._M_t.
                      super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                      super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                      super__Head_base<0UL,_int_*,_false>._M_head_impl[DVar12.len_]] != DVar12.len_)
                    ))) {
                  local_58.sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>
                  ._M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                  super__Head_base<0UL,_int_*,_false>._M_head_impl[DVar12.len_] = local_58.size_;
                  local_58.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
                  _M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                  super__Head_base<0UL,_int_*,_false>._M_head_impl[local_58.size_] = DVar12.len_;
                  uVar5 = local_58.size_ + 1;
                  local_58.size_ = uVar5;
                }
                goto LAB_001cc423;
              }
              DVar12.len_ = uVar8 >> 4;
            } while (0xf < uVar8);
          }
          pIVar3[(int)uVar2].field_1.out1_ = DVar12.len_;
        }
LAB_001cc423:
        _Var4._M_head_impl = _Var4._M_head_impl + 1;
        puVar7 = (uint *)(local_58.dense_.ptr_._M_t.
                          super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                          super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                          super__Head_base<0UL,_int_*,_false>._M_head_impl + (int)uVar5);
      } while ((uint *)_Var4._M_head_impl != puVar7);
    }
    DVar12.len_ = this->start_;
    local_58.size_ = 0;
    if ((((long)DVar12.len_ != 0) &&
        ((uint *)local_58.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
                 _M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl != (uint *)0x0)) &&
       ((uint)DVar12.len_ <
        (uint)local_58.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t
              .super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
              super__Tuple_impl<1UL,_re2::PODArray<int>::Deleter>.
              super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false>._M_head_impl.len_)) {
      local_58.sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
      super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl[DVar12.len_] = 0;
      *local_58.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
       super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
       super__Head_base<0UL,_int_*,_false>._M_head_impl = DVar12.len_;
      uVar5 = 1;
      puVar7 = (uint *)(local_58.dense_.ptr_._M_t.
                        super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                        super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                        super__Head_base<0UL,_int_*,_false>._M_head_impl + 1);
      pIVar3 = (this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
               super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
               super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
      _Var4._M_head_impl =
           local_58.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
           super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
      local_58.size_ = uVar5;
      do {
        uVar2 = *_Var4._M_head_impl;
        uVar8 = pIVar3[(int)uVar2].out_opcode_;
        if (0xf < uVar8) {
          DVar12.len_ = uVar8 >> 4;
          if (((uint)DVar12.len_ <
               (uint)local_58.dense_.ptr_._M_t.
                     super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                     super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                     super__Tuple_impl<1UL,_re2::PODArray<int>::Deleter>.
                     super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false>._M_head_impl.len_) &&
             ((uVar5 <= (uint)local_58.sparse_.ptr_._M_t.
                              super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                              super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                              super__Head_base<0UL,_int_*,_false>._M_head_impl[(uint)DVar12.len_] ||
              (local_58.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
               _M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl
               [local_58.sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
                _M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                super__Head_base<0UL,_int_*,_false>._M_head_impl[(uint)DVar12.len_]] != DVar12.len_)
              ))) {
            local_58.sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
            super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl[(uint)DVar12.len_] = uVar5;
            *puVar7 = DVar12.len_;
            uVar5 = local_58.size_ + 1;
            uVar8 = pIVar3[(int)uVar2].out_opcode_;
            local_58.size_ = uVar5;
          }
        }
        if ((uVar8 & 7) == 0) {
          DVar12.len_ = pIVar3[(int)uVar2].field_1.out1_;
          lVar11 = (long)DVar12.len_;
          if (((lVar11 != 0) &&
              ((uint)DVar12.len_ <
               (uint)local_58.dense_.ptr_._M_t.
                     super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                     super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                     super__Tuple_impl<1UL,_re2::PODArray<int>::Deleter>.
                     super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false>._M_head_impl.len_))
             && ((uVar5 <= (uint)local_58.sparse_.ptr_._M_t.
                                 super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                                 super__Head_base<0UL,_int_*,_false>._M_head_impl[lVar11] ||
                 (local_58.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
                  _M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                  super__Head_base<0UL,_int_*,_false>._M_head_impl
                  [local_58.sparse_.ptr_._M_t.
                   super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                   super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl[lVar11]] != DVar12.len_)))) {
            local_58.sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
            super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl[lVar11] = uVar5;
            local_58.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
            super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)uVar5] = DVar12.len_;
            uVar5 = local_58.size_ + 1;
            uVar8 = pIVar3[(int)uVar2].out_opcode_;
            local_58.size_ = uVar5;
          }
        }
        if ((uVar8 & 7) == 0) {
          uVar9 = uVar8 >> 4;
          pIVar1 = pIVar3 + pIVar3[(int)uVar2].field_1.cap_;
          uVar13 = pIVar3[uVar9].out_opcode_;
          if (((((uVar13 & 7) == 2) && (uVar13 >> 4 == uVar2)) &&
              (pIVar3[uVar9].field_1.field_3.lo_ == '\0')) &&
             (pIVar3[uVar9].field_1.field_3.hi_ == 0xff)) {
            pIVar10 = pIVar1;
            while( true ) {
              uVar9 = pIVar10->out_opcode_ & 7;
              if ((0x48U >> uVar9 & 1) == 0) break;
              pIVar10 = (this->inst_).ptr_._M_t.
                        super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                        .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl +
                        (pIVar10->out_opcode_ >> 4);
            }
            if ((0x97U >> uVar9 & 1) != 0) goto LAB_001cc58c;
          }
          else {
LAB_001cc58c:
            for (; (0x48U >> (uVar13 & 7) & 1) != 0;
                uVar13 = (this->inst_).ptr_._M_t.
                         super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                         .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl[uVar13 >> 4].
                         out_opcode_) {
            }
            if ((((0x97U >> (uVar13 & 7) & 1) != 0) || ((pIVar1->out_opcode_ & 7) != 2)) ||
               ((pIVar1->out_opcode_ >> 4 != uVar2 ||
                (((pIVar1->field_1).field_3.lo_ != '\0' || ((pIVar1->field_1).field_3.hi_ != 0xff)))
                ))) goto LAB_001cc5ab;
          }
          pIVar3[(int)uVar2].out_opcode_ = uVar8 | 1;
        }
LAB_001cc5ab:
        _Var4._M_head_impl = _Var4._M_head_impl + 1;
        puVar7 = (uint *)(local_58.dense_.ptr_._M_t.
                          super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                          super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                          super__Head_base<0UL,_int_*,_false>._M_head_impl + (int)uVar5);
      } while ((uint *)_Var4._M_head_impl != puVar7);
    }
  }
  SparseSetT<void>::~SparseSetT(&local_58);
  return;
}

Assistant:

void Prog::Optimize() {
  Workq q(size_);

  // Eliminate nops.  Most are taken out during compilation
  // but a few are hard to avoid.
  q.clear();
  AddToQueue(&q, start_);
  for (Workq::iterator i = q.begin(); i != q.end(); ++i) {
    int id = *i;

    Inst* ip = inst(id);
    int j = ip->out();
    Inst* jp;
    while (j != 0 && (jp=inst(j))->opcode() == kInstNop) {
      j = jp->out();
    }
    ip->set_out(j);
    AddToQueue(&q, ip->out());

    if (ip->opcode() == kInstAlt) {
      j = ip->out1();
      while (j != 0 && (jp=inst(j))->opcode() == kInstNop) {
        j = jp->out();
      }
      ip->out1_ = j;
      AddToQueue(&q, ip->out1());
    }
  }

  // Insert kInstAltMatch instructions
  // Look for
  //   ip: Alt -> j | k
  //	  j: ByteRange [00-FF] -> ip
  //    k: Match
  // or the reverse (the above is the greedy one).
  // Rewrite Alt to AltMatch.
  q.clear();
  AddToQueue(&q, start_);
  for (Workq::iterator i = q.begin(); i != q.end(); ++i) {
    int id = *i;
    Inst* ip = inst(id);
    AddToQueue(&q, ip->out());
    if (ip->opcode() == kInstAlt)
      AddToQueue(&q, ip->out1());

    if (ip->opcode() == kInstAlt) {
      Inst* j = inst(ip->out());
      Inst* k = inst(ip->out1());
      if (j->opcode() == kInstByteRange && j->out() == id &&
          j->lo() == 0x00 && j->hi() == 0xFF &&
          IsMatch(this, k)) {
        ip->set_opcode(kInstAltMatch);
        continue;
      }
      if (IsMatch(this, j) &&
          k->opcode() == kInstByteRange && k->out() == id &&
          k->lo() == 0x00 && k->hi() == 0xFF) {
        ip->set_opcode(kInstAltMatch);
      }
    }
  }
}